

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

char * al_fgets(ALLEGRO_FILE *f,char *buf,size_t max)

{
  int iVar1;
  long in_RDX;
  char *pcVar2;
  char *in_RSI;
  int c;
  char *p;
  ALLEGRO_FILE *in_stack_ffffffffffffffc8;
  int local_2c;
  char *local_28;
  long local_20;
  char *local_8;
  
  if (in_RDX == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = in_RSI;
    if (in_RDX == 1) {
      *in_RSI = '\0';
    }
    else {
      local_2c = al_fgetc(in_stack_ffffffffffffffc8);
      local_28 = in_RSI;
      local_20 = in_RDX;
      if (local_2c == -1) {
        local_8 = (char *)0x0;
      }
      else {
        do {
          pcVar2 = local_28 + 1;
          *local_28 = (char)local_2c;
          local_20 = local_20 + -1;
          if ((local_20 == 1) || (local_2c == 10)) break;
          local_2c = al_fgetc(in_stack_ffffffffffffffc8);
          local_28 = pcVar2;
        } while (local_2c != -1);
        if ((local_2c == -1) && (iVar1 = al_ferror((ALLEGRO_FILE *)0x175d93), iVar1 != 0)) {
          local_8 = (char *)0x0;
        }
        else {
          *pcVar2 = '\0';
        }
      }
    }
  }
  return local_8;
}

Assistant:

char *al_fgets(ALLEGRO_FILE *f, char * const buf, size_t max)
{
   char *p = buf;
   int c;
   ASSERT(f);
   ASSERT(buf);

   /* Handle silly cases. */
   if (max == 0) {
      return NULL;
   }
   if (max == 1) {
      *buf = '\0';
      return buf;
   }

   /* Return NULL if already at end of file. */
   if ((c = al_fgetc(f)) == EOF) {
      return NULL;
   }

   /* Fill buffer until empty, or we reach a newline or EOF or error. */
   do {
      *p++ = c;
      max--;
      if (max == 1 || c == '\n')
         break;
      c = al_fgetc(f);
   } while (c != EOF);

   /* Return NULL on error. */
   if (c == EOF && al_ferror(f)) {
      return NULL;
   }

   /* Add null terminator. */
   ASSERT(max >= 1);
   *p = '\0';

   return buf;
}